

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVstone INT_REVcreate_auto_stone
                  (CMConnection conn,int period_sec,int period_usec,char *action_spec,
                  EVstone out_stone)

{
  int iVar1;
  CManager cm;
  CManager in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  EVcreate_auto_stone_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CManager in_stack_ffffffffffffffc0;
  EVstone in_stack_ffffffffffffffd4;
  
  memset(&stack0xffffffffffffffb0,0,0x20);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffc0,
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  cm = (CManager)INT_CMlookup_format((CManager)*in_RDI,EVcreate_auto_stone_req_formats);
  if (cm == (CManager)0x0) {
    cm = (CManager)
         INT_CMregister_format
                   ((CManager)CONCAT44(in_stack_ffffffffffffffbc,in_EDX),
                    (FMStructDescList)CONCAT44(in_ESI,iVar1));
  }
  INT_CMCondition_set_client_data(in_RCX,in_stack_ffffffffffffffbc,(void *)CONCAT44(in_ESI,iVar1));
  INT_CMwrite((CMConnection)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffa8,(void *)0x1553a0);
  INT_CMCondition_wait(cm,in_stack_ffffffffffffffd4);
  return in_stack_ffffffffffffffd4;
}

Assistant:

extern EVstone
INT_REVcreate_auto_stone(CMConnection conn, int period_sec, int period_usec, char *action_spec, EVstone out_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_auto_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_auto_stone_req_formats);
    request.period_sec = period_sec;
    request.period_usec = period_usec;
    request.action_spec = action_spec;
    request.out_stone = out_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_auto_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}